

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O2

void MyGame_Example_Monster_sort(MyGame_Example_Monster_mutable_table_t t)

{
  MyGame_Example_Monster_vec_t vec;
  MyGame_Example_Monster_table_t t_00;
  ulong uVar1;
  size_t i;
  MyGame_Example_Any_union_t MVar2;
  MyGame_Example_Any_mutable_union_t u;
  
  for (; t != (MyGame_Example_Monster_table_t)0x0; t = MyGame_Example_Monster_enemy_get(t)) {
    MVar2 = MyGame_Example_Monster_test_union(t);
    u._1_7_ = 0;
    u.type = MVar2.type;
    u.value = MVar2.value;
    MyGame_Example_Any_sort(u);
    vec = MyGame_Example_Monster_testarrayoftables_get(t);
    if (vec == (MyGame_Example_Monster_vec_t)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)vec[-1];
    }
    for (i = 0; uVar1 != i; i = i + 1) {
      t_00 = MyGame_Example_Monster_vec_at(vec,i);
      MyGame_Example_Monster_sort(t_00);
    }
  }
  return;
}

Assistant:

static void MyGame_Example_Monster_sort(MyGame_Example_Monster_mutable_table_t t)
{
    if (!t) return;
    __flatbuffers_sort_union_field(MyGame_Example_Monster, test, MyGame_Example_Any, t);
    __flatbuffers_sort_table_vector_field_elements(MyGame_Example_Monster, testarrayoftables, MyGame_Example_Monster, t);
    __flatbuffers_sort_table_field(MyGame_Example_Monster, enemy, MyGame_Example_Monster, t);
}